

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecSimulationDataGenerator.cpp
# Opt level: O1

U32 __thiscall
HdmiCecSimulationDataGenerator::GenerateSimulationData
          (HdmiCecSimulationDataGenerator *this,U64 largest_sample_requested,U32 sample_rate,
          SimulationChannelDescriptor **simulation_channel)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = AnalyzerHelpers::AdjustSimulationTargetSample
                    (largest_sample_requested,sample_rate,this->mSimulationSampleRateHz);
  while( true ) {
    uVar3 = SimulationChannelDescriptor::GetCurrentSampleNumber();
    if (uVar2 <= uVar3) break;
    if (this->mSimulateErrors == true) {
      iVar1 = rand();
      this->mErrorType = iVar1 % 5;
    }
    else {
      this->mErrorType = ERR_NOERROR;
    }
    GenVersionTransaction(this);
    AdvanceRand(this,5.0,15.0);
    if (this->mSimulateErrors == true) {
      iVar1 = rand();
      this->mErrorType = iVar1 % 5;
    }
    else {
      this->mErrorType = ERR_NOERROR;
    }
    GetStandbyTransaction(this);
    AdvanceRand(this,5.0,15.0);
    if (this->mSimulateErrors == true) {
      iVar1 = rand();
      this->mErrorType = iVar1 % 5;
    }
    else {
      this->mErrorType = ERR_NOERROR;
    }
    GetInitTransaction(this);
    AdvanceRand(this,5.0,15.0);
  }
  *simulation_channel = &this->mCecSimulationData;
  return 1;
}

Assistant:

U32 HdmiCecSimulationDataGenerator::GenerateSimulationData( U64 largest_sample_requested, U32 sample_rate,
                                                            SimulationChannelDescriptor** simulation_channel )
{
    const U64 lastSample = AnalyzerHelpers::AdjustSimulationTargetSample( largest_sample_requested, sample_rate, mSimulationSampleRateHz );

    while( mCecSimulationData.GetCurrentSampleNumber() < lastSample )
    {
        SetRandomErrorType();
        GenVersionTransaction();
        AdvanceRand( 5.0f, 15.0f );

        SetRandomErrorType();
        GetStandbyTransaction();
        AdvanceRand( 5.0f, 15.0f );

        SetRandomErrorType();
        GetInitTransaction();
        AdvanceRand( 5.0f, 15.0f );
    }

    *simulation_channel = &mCecSimulationData;
    return 1; // We are simulating one channel
}